

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void __thiscall Board::Board(Board *this,int color,GameBoard *gameBoard)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  int *piVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  *(undefined8 *)(this->rows + 0x15) = 0x1fffff00000000;
  this->rows[0] = 0xfff;
  this->cols[0xb] = 0x1fffff;
  lVar4 = 1;
  do {
    piVar5 = this->rows + lVar4;
    piVar5[0] = 0x801;
    piVar5[1] = 0x801;
    piVar5[2] = 0x801;
    auVar3 = _DAT_0011e240;
    auVar2 = _DAT_0011e230;
    auVar1 = _DAT_0011e220;
    piVar5[3] = 0x801;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x15);
  lVar4 = 0;
  do {
    auVar7._8_4_ = (int)lVar4;
    auVar7._0_8_ = lVar4;
    auVar7._12_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar8 = (auVar7 | auVar2) ^ auVar3;
    if (auVar8._4_4_ == -0x80000000 && auVar8._0_4_ < -0x7ffffff6) {
      this->cols[lVar4 + 1] = 1;
      this->cols[lVar4 + 2] = 1;
    }
    auVar7 = (auVar7 | auVar1) ^ auVar3;
    if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7ffffff6) {
      this->cols[lVar4 + 3] = 1;
      this->cols[lVar4 + 4] = 1;
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  piVar5 = gameBoard->gridInfo[color][1] + 1;
  lVar4 = 1;
  do {
    lVar6 = 0;
    do {
      if (piVar5[lVar6] != 0) {
        this->rows[lVar4] = this->rows[lVar4] | 1 << ((char)lVar6 + 1U & 0x1f);
        this->cols[lVar6 + 1] = this->cols[lVar6 + 1] | 1 << ((byte)lVar4 & 0x1f);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10);
    lVar4 = lVar4 + 1;
    piVar5 = piVar5 + 0xc;
  } while (lVar4 != 0x15);
  return;
}

Assistant:

Board::Board(int color, const GameBoard &gameBoard){
    setFrame();
    for (int i = 1; i <= MAPHEIGHT; ++i)
        for (int j = 1; j <= MAPWIDTH; ++j)
            if (gameBoard.gridInfo[color][i][j]){
                rows[i] |= 1 << j;
                cols[j] |= 1 << i;
            }
}